

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

Image * operator+(Image *__return_storage_ptr__,Image *image1,Image *image2)

{
  int *piVar1;
  int *piVar2;
  int **ppiVar3;
  long lVar4;
  long lVar5;
  Image result;
  Image local_30;
  
  local_30.row = image1->row;
  local_30.col = image1->col;
  local_30.maxGray = image1->maxGray;
  local_30.matrix = clone_matrix<int>(image1->matrix,local_30.row,local_30.col);
  if (0 < image1->row) {
    ppiVar3 = image2->matrix;
    lVar4 = 0;
    do {
      if (0 < image1->col) {
        piVar1 = ppiVar3[lVar4];
        piVar2 = local_30.matrix[lVar4];
        lVar5 = 0;
        do {
          piVar2[lVar5] = piVar2[lVar5] + piVar1[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 < image1->col);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < image1->row);
  }
  Image::normalize(&local_30);
  __return_storage_ptr__->row = local_30.row;
  __return_storage_ptr__->col = local_30.col;
  __return_storage_ptr__->maxGray = local_30.maxGray;
  ppiVar3 = clone_matrix<int>(local_30.matrix,local_30.row,local_30.col);
  __return_storage_ptr__->matrix = ppiVar3;
  free_matrix<int>(local_30.matrix,local_30.row);
  return __return_storage_ptr__;
}

Assistant:

Image operator+(Image& image1, Image& image2)
{
    Image result = image1.clone();

    for (int i = 0; i < image1.row; ++i) {
        for (int j = 0; j < image1.col; ++j) {
            result.matrix[i][j] += image2.matrix[i][j];
        }
    }

    return result.normalize();
}